

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepare.cc
# Opt level: O2

void __thiscall re2c::DFA::split(DFA *this,State *s)

{
  State *this_00;
  Span *pSVar1;
  
  this_00 = (State *)operator_new(0x58);
  State::State(this_00);
  addState(this,this_00,s);
  Action::set_move(&this_00->action);
  this_00->rule = s->rule;
  this_00->fill = s->fill;
  (this_00->go).nSpans = (s->go).nSpans;
  (this_00->go).span = (s->go).span;
  (this_00->go).type = (s->go).type;
  (this_00->go).info = (s->go).info;
  s->rule = (RuleOp *)0x0;
  (s->go).nSpans = 1;
  pSVar1 = (Span *)operator_new(0x10);
  (s->go).span = pSVar1;
  pSVar1->ub = this->ubChar;
  pSVar1->to = this_00;
  return;
}

Assistant:

void DFA::split(State *s)
{
	State *move = new State;
	addState(move, s);
	move->action.set_move ();
	move->rule = s->rule;
	move->fill = s->fill;
	move->go = s->go;
	s->rule = NULL;
	s->go.nSpans = 1;
	s->go.span = allocate<Span> (1);
	s->go.span[0].ub = ubChar;
	s->go.span[0].to = move;
}